

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_gb16(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  byte bVar2;
  double dVar3;
  double a1;
  double a;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if (in->a < 1) {
    iVar1 = back->ig;
    out->b = iVar1;
    out->g = iVar1;
    out->r = iVar1;
  }
  else if (in->a < 0xffff) {
    dVar3 = (double)in->a / 65535.0;
    bVar2 = sRGB((double)in->g * (dVar3 / 65535.0) + back->dg * (1.0 - dVar3));
    out->b = (uint)bVar2;
    out->g = (uint)bVar2;
    out->r = (uint)bVar2;
  }
  else {
    bVar2 = isRGB(in->g);
    out->b = (uint)bVar2;
    out->g = (uint)bVar2;
    out->r = (uint)bVar2;
  }
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_gb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else if (in->a >= 65535)
      out->r = out->g = out->b = isRGB(in->g);

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}